

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::set_string_value(UninterpretedOption *this,string *value)

{
  string *this_00;
  string *value_local;
  UninterpretedOption *this_local;
  
  set_has_string_value(this);
  if (this->string_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00);
    this->string_value_ = this_00;
  }
  std::__cxx11::string::assign((string *)this->string_value_);
  return;
}

Assistant:

inline void UninterpretedOption::set_string_value(const ::std::string& value) {
  set_has_string_value();
  if (string_value_ == &::google::protobuf::internal::kEmptyString) {
    string_value_ = new ::std::string;
  }
  string_value_->assign(value);
}